

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_parser_t * mpc_expect(mpc_parser_t *a,char *expected)

{
  mpc_parser_t *pmVar1;
  size_t sVar2;
  char *__dest;
  
  pmVar1 = (mpc_parser_t *)calloc(1,0x38);
  pmVar1->type = '\x05';
  (pmVar1->data).expect.x = a;
  sVar2 = strlen(expected);
  __dest = (char *)malloc(sVar2 + 1);
  (pmVar1->data).lift.x = __dest;
  strcpy(__dest,expected);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_expect(mpc_parser_t *a, const char *expected) {
  mpc_parser_t *p = mpc_undefined();
  p->type = MPC_TYPE_EXPECT;
  p->data.expect.x = a;
  p->data.expect.m = malloc(strlen(expected) + 1);
  strcpy(p->data.expect.m, expected);
  return p;
}